

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

void __thiscall
chaiscript::detail::Any::Any<std::shared_ptr<short>const&,void>
          (Any *this,shared_ptr<short> *t_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  _Head_base<0UL,_chaiscript::detail::Any::Data_*,_false> _Var2;
  __shared_ptr<short,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  _Var2._M_head_impl = (Data *)operator_new(0x20);
  std::__shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,&t_value->super___shared_ptr<short,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_pi = local_28._M_refcount._M_pi;
  (_Var2._M_head_impl)->m_type = (type_info *)&std::shared_ptr<short>::typeinfo;
  (_Var2._M_head_impl)->_vptr_Data = (_func_int **)&PTR__Data_Impl_0031d8f8;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Var2._M_head_impl[1]._vptr_Data = (_func_int **)local_28._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var2._M_head_impl + 1) + 8) =
       _Var1._M_pi;
  local_28._M_ptr = (element_type *)0x0;
  (this->m_data)._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl = _Var2._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

explicit Any(ValueType &&t_value)
          : m_data(std::unique_ptr<Data>(new Data_Impl<typename std::decay<ValueType>::type>(std::forward<ValueType>(t_value))))
        {
        }